

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

var __thiscall cs::runtime_type::parse_add(runtime_type *this,var *a,var *b)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long *plVar5;
  numeric *this_00;
  numeric *rhs;
  runtime_error *this_01;
  any *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_310e9938_for_data local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  string local_40;
  
  if (b->mDat == (proxy *)0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*b->mDat->data->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = *(char **)(puVar3 + 8);
  if ((pcVar1 == "N2cs7numericE") ||
     ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N2cs7numericE"), iVar2 == 0)))) {
    if (in_RCX->mDat == (proxy *)0x0) {
      puVar3 = &void::typeinfo;
    }
    else {
      iVar2 = (*in_RCX->mDat->data->_vptr_baseHolder[2])();
      puVar3 = (undefined *)CONCAT44(extraout_var_00,iVar2);
    }
    pcVar1 = *(char **)(puVar3 + 8);
    if ((pcVar1 == "N2cs7numericE") ||
       ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N2cs7numericE"), iVar2 == 0)))) {
      this_00 = cs_impl::any::const_val<cs::numeric>(b);
      rhs = cs_impl::any::const_val<cs::numeric>(in_RCX);
      numeric::operator+(this_00,rhs);
      cs_impl::any::any<cs::numeric>((any *)this,(numeric *)&local_68);
      return (var)(proxy *)this;
    }
  }
  if (b->mDat == (proxy *)0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*b->mDat->data->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var_01,iVar2);
  }
  pcVar1 = *(char **)(puVar3 + 8);
  if (((pcVar1 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") ||
      ((*pcVar1 != '*' &&
       (iVar2 = strcmp(pcVar1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"), iVar2 == 0)))
      ) && (in_RCX->mDat != (proxy *)0x0)) {
    pbVar4 = cs_impl::any::const_val<std::__cxx11::string>(b);
    cs_impl::any::to_string_abi_cxx11_(&local_40,in_RCX);
    plVar5 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_40,0,(char *)0x0,(ulong)(pbVar4->_M_dataplus)._M_p);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar6) {
      local_58._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_58._8_8_ = plVar5[3];
      local_68._int = (numeric_integer)&local_58;
    }
    else {
      local_58._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_68._int =
           (numeric_integer)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar5;
    }
    local_68._8_8_ = plVar5[1];
    *plVar5 = (long)paVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    cs_impl::any::make<std::__cxx11::string,std::__cxx11::string>
              ((any *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._int != &local_58) {
      operator_delete((void *)local_68._int,local_58._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return (var)(proxy *)this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
  local_68._int = (numeric_integer)&local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Unsupported operator operations(Add).","");
  runtime_error::runtime_error(this_01,(string *)&local_68);
  __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_add(const var &a, const var &b)
	{
		if (a.type() == typeid(numeric) && b.type() == typeid(numeric))
			return a.const_val<numeric>() + b.const_val<numeric>();
		else if (a.type() == typeid(string) && b.usable())
			return var::make<std::string>(a.const_val<string>() + b.to_string());
		else
			throw runtime_error("Unsupported operator operations(Add).");
	}